

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Numeric.hpp
# Opt level: O2

Gen<unsigned_long> *
rc::gen::inRange<unsigned_long>
          (Gen<unsigned_long> *__return_storage_ptr__,unsigned_long min,unsigned_long max)

{
  anon_class_16_2_441cd557 local_18;
  
  local_18.max = max;
  local_18.min = min;
  Gen<unsigned_long>::
  Gen<rc::gen::inRange<unsigned_long>(unsigned_long,unsigned_long)::_lambda(rc::Random_const&,int)_1_,void>
            (__return_storage_ptr__,&local_18);
  return __return_storage_ptr__;
}

Assistant:

Gen<T> inRange(T min, T max) {
  return [=](const Random &random, int size) {
    if (max <= min) {
      std::string msg;
      msg += "Invalid range [" + std::to_string(min);
      msg += ", " + std::to_string(max) + ")";
      throw GenerationFailure(msg);
    }

    const auto rangeSize =
        detail::scaleInteger(static_cast<Random::Number>(max) -
                                 static_cast<Random::Number>(min) - 1,
                             size) +
        1;
    const auto value =
        static_cast<T>((Random(random).next() % rangeSize) + min);
    assert(value >= min && value < max);
    return shrinkable::shrinkRecur(
        value, [=](T x) { return shrink::towards<T>(x, min); });
  };
}